

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

void Min_CubeWrite(FILE *pFile,Min_Cube_t *pCube)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int local_1c;
  int i;
  Min_Cube_t *pCube_local;
  FILE *pFile_local;
  
  uVar1 = *(uint *)&pCube->field_0x8;
  uVar2 = Min_CubeCountLits(pCube);
  if (uVar1 >> 0x16 != uVar2) {
    __assert_fail("(int)pCube->nLits == Min_CubeCountLits(pCube)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinUtil.c"
                  ,0x6d,"void Min_CubeWrite(FILE *, Min_Cube_t *)");
  }
  for (local_1c = 0; local_1c < (int)(*(uint *)&pCube->field_0x8 & 0x3ff); local_1c = local_1c + 1)
  {
    iVar3 = Min_CubeHasBit(pCube,local_1c << 1);
    if (iVar3 == 0) {
      iVar3 = Min_CubeHasBit(pCube,local_1c * 2 + 1);
      if (iVar3 == 0) {
        fprintf((FILE *)pFile,"?");
      }
      else {
        fprintf((FILE *)pFile,"1");
      }
    }
    else {
      iVar3 = Min_CubeHasBit(pCube,local_1c * 2 + 1);
      if (iVar3 == 0) {
        fprintf((FILE *)pFile,"0");
      }
      else {
        fprintf((FILE *)pFile,"-");
      }
    }
  }
  fprintf((FILE *)pFile," 1\n");
  return;
}

Assistant:

void Min_CubeWrite( FILE * pFile, Min_Cube_t * pCube )
{
    int i;
    assert( (int)pCube->nLits == Min_CubeCountLits(pCube) );
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeHasBit(pCube, i*2) )
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
                fprintf( pFile, "-" );
            else
                fprintf( pFile, "0" );
        }
        else
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
                fprintf( pFile, "1" );
            else
                fprintf( pFile, "?" );
        }
    fprintf( pFile, " 1\n" );
//    fprintf( pFile, " %d\n", pCube->nLits );
}